

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

Poll * __thiscall Poll::subscribe(Poll *this,shared_ptr<Subscriber> *sub)

{
  int iVar1;
  element_type *peVar2;
  mapped_type *this_00;
  int local_24;
  value_type local_20;
  shared_ptr<Subscriber> *local_18;
  shared_ptr<Subscriber> *sub_local;
  Poll *this_local;
  
  local_18 = sub;
  sub_local = (shared_ptr<Subscriber> *)this;
  peVar2 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      sub);
  iVar1 = Subscriber::get_fd(peVar2);
  if (-1 < iVar1) {
    peVar2 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )sub);
    iVar1 = Subscriber::get_fd(peVar2);
    iVar1 = ioctl(iVar1,0x5421,&YES);
    no_err(iVar1,"Setting to non blocking");
  }
  peVar2 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      sub);
  local_20.fd = Subscriber::get_fd(peVar2);
  peVar2 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      sub);
  local_20.events = Subscriber::get_mask(peVar2);
  local_20.revents = 0;
  std::vector<pollfd,_std::allocator<pollfd>_>::push_back(&this->fds,&local_20);
  peVar2 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      sub);
  local_24 = Subscriber::get_fd(peVar2);
  this_00 = std::
            unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
            ::operator[](&this->subs,&local_24);
  std::shared_ptr<Subscriber>::operator=(this_00,sub);
  return this;
}

Assistant:

Poll &Poll::subscribe(std::shared_ptr<Subscriber> sub) {
  if (sub->get_fd() >= 0)
    no_err(ioctl(sub->get_fd(), FIONBIO, (char *) &YES), "Setting to non blocking");
  fds.push_back({.fd = sub->get_fd(), .events = sub->get_mask(), .revents = 0});
  subs[sub->get_fd()] = sub;
  return *this;
}